

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

int MD5_Update(MD5_CTX *c,void *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = c->Nl;
  uVar6 = uVar5 >> 3 & 0x3f;
  uVar3 = (ulong)uVar6;
  uVar1 = (uint)len;
  c->Nl = uVar1 * 8 + uVar5;
  if (CARRY4(uVar1 * 8,uVar5)) {
    c->Nh = c->Nh + 1;
  }
  c->Nh = c->Nh + (int)((len & 0xffffffff) >> 0x1d);
  uVar5 = 0x40 - uVar6;
  if (uVar1 < uVar5) {
    uVar5 = 0;
  }
  else {
    memcpy((void *)((long)c->data + uVar3),data,(ulong)uVar5);
    MD5Transform(&c->A,(uchar *)c->data);
    uVar2 = uVar6 ^ 0x7f;
    if ((uVar6 ^ 0x7f) < uVar1) {
      do {
        uVar5 = uVar2;
        MD5Transform(&c->A,(uchar *)((ulong)(uVar5 - 0x3f) + (long)data));
        uVar2 = uVar5 + 0x40;
      } while (uVar5 + 0x40 < uVar1);
      uVar5 = uVar5 + 1;
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
    }
  }
  pvVar4 = memcpy((void *)((long)c->data + uVar3),(void *)((long)data + (ulong)uVar5),
                  (ulong)(uVar1 - uVar5));
  return (int)pvVar4;
}

Assistant:

static void MD5_Update (struct md5_ctx *context,    /* context */
                        const unsigned char *input, /* input block */
                        unsigned int inputLen)      /* length of input block */
{
  unsigned int i, bufindex, partLen;

  /* Compute number of bytes mod 64 */
  bufindex = (unsigned int)((context->count[0] >> 3) & 0x3F);

  /* Update number of bits */
  if((context->count[0] += ((UINT4)inputLen << 3))
      < ((UINT4)inputLen << 3))
    context->count[1]++;
  context->count[1] += ((UINT4)inputLen >> 29);

  partLen = 64 - bufindex;

  /* Transform as many times as possible. */
  if(inputLen >= partLen) {
    memcpy(&context->buffer[bufindex], input, partLen);
    MD5Transform(context->state, context->buffer);

    for(i = partLen; i + 63 < inputLen; i += 64)
      MD5Transform(context->state, &input[i]);

    bufindex = 0;
  }
  else
    i = 0;

  /* Buffer remaining input */
  memcpy(&context->buffer[bufindex], &input[i], inputLen-i);
}